

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O3

bool __thiscall
tsbp::LeftmostActiveOnly::PlaceBottomLeftPlacement
          (LeftmostActiveOnly *this,Node *node,Rectangle *item)

{
  int iVar1;
  Packing2D *packing;
  bool bVar2;
  int iVar3;
  int newActiveX;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  int local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  double local_40;
  
  packing = (node->Packing)._M_t.
            super___uniq_ptr_impl<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_>._M_t.
            super__Tuple_impl<0UL,_tsbp::Packing2D_*,_std::default_delete<tsbp::Packing2D>_>.
            super__Head_base<0UL,_tsbp::Packing2D_*,_false>._M_head_impl;
  bVar2 = IsPlacementFeasible(this,packing,item);
  if (bVar2) {
    _local_58 = *(_func_int ***)packing;
    uStack_50._0_4_ = item->Dx;
    uStack_50._4_4_ = item->Dy;
    local_48._0_4_ = item->InternId;
    local_48._4_4_ = item->ExternId;
    local_40 = (double)(uStack_50._4_4_ * (int)uStack_50);
    Packing2D::AddItem(packing,(Rectangle *)&stack0xffffffffffffffa8,
                       (node->super_BaseNode).ItemIdToPlace);
    iVar7 = packing->ActiveX;
    iVar1 = packing->ActiveY;
    AddSuccessfulPlacementDummy(this,packing);
    iVar3 = item->Dy;
    iVar4 = iVar3 + iVar1;
    uVar6 = (packing->PlacedAreaVector).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[iVar4];
    uVar5 = (packing->DeactivatedAreaVector).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[iVar4];
    if (uVar5 < uVar6) {
      uVar5 = uVar6;
    }
    if ((iVar4 == (this->container).super_Rectangle.Dy) ||
       (uVar6 = (long)item->Dx + (long)iVar7, uVar6 < uVar5)) {
      FindNewBottomLeft((LeftmostActiveOnly *)&stack0xffffffffffffffa8,(Packing2D *)this);
      packing->ActiveX = (int)uStack_50;
      packing->ActiveY = local_58;
      iVar7 = iVar7 + item->Dx;
    }
    else {
      packing->ActiveX = (int)uVar5;
      packing->ActiveY = packing->ActiveY + iVar3;
      iVar7 = (int)uVar6;
    }
    iVar3 = packing->MaxX;
    if (packing->MaxX <= iVar7) {
      iVar3 = iVar7;
    }
    packing->MaxX = iVar3;
    if (iVar1 == 0) {
      if (iVar7 <= packing->AbscissaMaxX) {
        __assert_fail("placedX + item.Dx > packing.AbscissaMaxX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ktnr[P]TwoStepBranchingProcedure/tsbp/src/BranchAndBound.cpp"
                      ,0x4ae,
                      "bool tsbp::LeftmostActiveOnly::PlaceBottomLeftPlacement(Node &, const Rectangle &)"
                     );
      }
      packing->AbscissaMaxX = iVar7;
    }
  }
  return bVar2;
}

Assistant:

bool LeftmostActiveOnly::PlaceBottomLeftPlacement(Node& node, const Rectangle& item)
{
    Packing2D& packing = *node.Packing;

    if (IsPlacementFeasible(packing, item))
    {
        packing.AddItem(Rectangle{packing.ActiveX, packing.ActiveY, item.Dx, item.Dy, item.InternId, item.ExternId}, node.ItemIdToPlace);

        int placedX = packing.ActiveX;
        int placedY = packing.ActiveY;

        // Add dummy item for area left of current placement.
        AddSuccessfulPlacementDummy(packing);

        size_t xAboveNewY = std::max<size_t>(packing.PlacedAreaVector[placedY + item.Dy], packing.DeactivatedAreaVector[placedY + item.Dy]);

        if (placedY + item.Dy == this->container.Dy || xAboveNewY > placedX + item.Dx)
        {
            auto [newActiveX, newActiveY] = FindNewBottomLeft(packing);

            packing.ActiveX = newActiveX;
            packing.ActiveY = newActiveY;
        }
        else
        {
            int newActiveX = xAboveNewY;

            packing.ActiveX = newActiveX;
            packing.ActiveY += item.Dy;
        }

        packing.MaxX = std::max<int>(packing.MaxX, placedX + item.Dx);
        if (placedY == 0)
        {
            assert(placedX + item.Dx > packing.AbscissaMaxX);
            packing.AbscissaMaxX = placedX + item.Dx;
        }

        return true;
    }

    // Placement was infeasible: Prune node, deactivate placement i, activate placement ii.
    return false;
}